

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_buffer_decode(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  IRType t;
  ulong uVar3;
  SBufExt sbx;
  SBufExt local_68;
  
  if ((rd->argv->field_4).it >> 0xf == 0x1fffb) {
    uVar3 = (ulong)rd->argv->field_4 & 0x7fffffffffff;
    (J->fold).ins.field_0.ot = 0x3f09;
    (J->fold).ins.field_1.op12 = 0x27fff;
    TVar1 = lj_opt_fold(J);
    TVar2 = lj_ir_call(J,IRCALL_lj_serialize_decode,(ulong)TVar1,(ulong)*J->base);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x12000000;
    lj_opt_fold(J);
    local_68.field_4 = (anon_union_8_2_d9f1b0d6_for_SBufExt_4)0x0;
    local_68.dict_str.gcptr64 = 0;
    local_68.dict_mt.gcptr64 = 0;
    local_68.depth = 0;
    local_68._68_4_ = 0;
    local_68.b = (char *)(uVar3 + 0x18);
    local_68.L.ptr64 = (long)&(J->L->nextgc).gcptr64 + 3;
    local_68.w = (char *)(uVar3 + *(uint *)(uVar3 + 0x14) + 0x18);
    local_68.e = local_68.w;
    local_68.r = local_68.b;
    t = lj_serialize_peektype(&local_68);
    TVar1 = lj_record_vload(J,TVar1,0,t);
    *J->base = TVar1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_decode(jit_State *J, RecordFFData *rd)
{
  if (tvisstr(&rd->argv[0])) {
    GCstr *str = strV(&rd->argv[0]);
    SBufExt sbx;
    IRType t;
    TRef tmp = recff_tmpref(J, TREF_NIL, IRTMPREF_OUT1);
    TRef tr = lj_ir_call(J, IRCALL_lj_serialize_decode, tmp, J->base[0]);
    /* IR_USE needed for IR_CALLA, because the decoder may throw non-OOM.
    ** That's why IRCALL_lj_serialize_decode needs a fake INT result.
    */
    emitir(IRT(IR_USE, IRT_NIL), tr, 0);
    memset(&sbx, 0, sizeof(SBufExt));
    lj_bufx_set_cow(J->L, &sbx, strdata(str), str->len);
    t = (IRType)lj_serialize_peektype(&sbx);
    J->base[0] = lj_record_vload(J, tmp, 0, t);
  }  /* else: Interpreter will throw. */
}